

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.hpp
# Opt level: O2

Matrix<float,__1,__1,_0,__1,__1> * __thiscall
openjij::utility::gen_matrix_from_trotter_spins<float,0>
          (Matrix<float,__1,__1,_0,__1,__1> *__return_storage_ptr__,utility *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *trotter_spins)

{
  int iVar1;
  Scalar *pSVar2;
  long lVar3;
  long *plVar4;
  size_t i;
  ulong row;
  size_t j;
  ulong uVar5;
  unsigned_long local_40;
  unsigned_long local_38;
  
  plVar4 = *(long **)this;
  local_38 = (plVar4[1] - *plVar4 >> 2) + 1;
  local_40 = (*(long *)(this + 8) - (long)plVar4) / 0x18;
  Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<unsigned_long,unsigned_long>
            ((Matrix<float,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_38,&local_40);
  plVar4 = *(long **)this;
  for (uVar5 = 0; lVar3 = *(long *)(this + 8), uVar5 < (ulong)((lVar3 - (long)plVar4) / 0x18);
      uVar5 = uVar5 + 1) {
    for (row = 0; row < (ulong)(plVar4[uVar5 * 3 + 1] - plVar4[uVar5 * 3] >> 2); row = row + 1) {
      iVar1 = *(int *)(plVar4[uVar5 * 3] + row * 4);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1> *)
                          __return_storage_ptr__,row,uVar5);
      *pSVar2 = (float)iVar1;
      plVar4 = *(long **)this;
    }
  }
  for (uVar5 = 0; uVar5 < (ulong)((lVar3 - (long)plVar4) / 0x18); uVar5 = uVar5 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,plVar4[1] - *plVar4 >> 2,uVar5);
    *pSVar2 = 1.0;
    plVar4 = *(long **)this;
    lVar3 = *(long *)(this + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static Eigen::Matrix<FloatType, Eigen::Dynamic, Eigen::Dynamic, Options>
gen_matrix_from_trotter_spins(const std::vector<graph::Spins> &trotter_spins) {
  Eigen::Matrix<FloatType, Eigen::Dynamic, Eigen::Dynamic, Options> ret_mat(
      trotter_spins[0].size() + 1, trotter_spins.size());

  // initialize spin
  for (size_t j = 0; j < trotter_spins.size(); j++) {
    for (size_t i = 0; i < trotter_spins[j].size(); i++) {
      ret_mat(i, j) = trotter_spins[j][i];
    }
  }

  // dummy spins
  for (size_t j = 0; j < trotter_spins.size(); j++) {
    ret_mat(trotter_spins[0].size(), j) = 1;
  }

  return ret_mat;
}